

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ZSTD_compressionParameters cParams;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  uVar7 = 0;
  ZSTD_getCParamsFromCCtxParams(&cParams,params,0xffffffffffffffff,0);
  uVar8 = 1L << ((byte)cParams.windowLog & 0x3f);
  if (0x1ffff < uVar8) {
    uVar8 = 0x20000;
  }
  sVar5 = ZSTD_sizeof_matchState(&cParams,1);
  uVar1 = (params->ldmParams).hashLog;
  uVar2 = (params->ldmParams).bucketSizeLog;
  bVar3 = (byte)uVar1;
  bVar6 = bVar3 - (char)uVar2;
  if (uVar1 < uVar2) {
    bVar6 = 0;
  }
  uVar4 = uVar7;
  if ((params->ldmParams).enableLdm != 0) {
    uVar7 = (ulong)(uint)((int)((uVar8 & 0xffffffff) / (ulong)(params->ldmParams).minMatchLength) *
                         0xc);
    uVar4 = (8L << (bVar3 & 0x3f)) + (1L << (bVar6 & 0x3f));
  }
  return uVar7 + uVar8 + sVar5 + uVar4 +
                 (ulong)(uint)((int)((uVar8 & 0xffffffff) / (ulong)((cParams.minMatch != 3) + 3)) *
                              0xb) + 0x4088;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        U32    const divider = (cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
        size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
        size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 1);

        size_t const ldmSpace = ZSTD_ldm_getTableSize(params->ldmParams);
        size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize) * sizeof(rawSeq));

        size_t const neededSpace = entropySpace + blockStateSpace + tokenSpace +
                                   matchStateSize + ldmSpace + ldmSeqSpace;
        size_t const cctxSpace = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx));

        DEBUGLOG(5, "sizeof(ZSTD_CCtx) : %u", (U32)cctxSpace);
        DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
        return cctxSpace + neededSpace;
    }
}